

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,StringPiece *lhs,SymbolEntry *rhs)

{
  char *__s1;
  ulong uVar1;
  _Alloc_hider __s2;
  size_type sVar2;
  int iVar3;
  ulong __n;
  size_type __n_00;
  bool bVar4;
  StringPiece x;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  string local_90;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_70;
  StringPiece local_50;
  void *local_40;
  ulong uStack_38;
  
  local_50.ptr_ = lhs->ptr_;
  local_50.length_ = lhs->length_;
  local_40 = (void *)0x0;
  uStack_38 = 0;
  GetParts(&local_70,this,rhs);
  local_90._0_16_ = stringpiece_internal::StringPiece::substr(&local_50,0,local_70.first.length_);
  x = stringpiece_internal::StringPiece::substr(&local_70.first,0,local_50.length_);
  iVar3 = stringpiece_internal::StringPiece::compare((StringPiece *)&local_90,x);
  uVar1 = uStack_38;
  if (iVar3 == 0) {
    if (local_50.length_ == local_70.first.length_) {
      __n = local_70.second.length_;
      if (uStack_38 < local_70.second.length_) {
        __n = uStack_38;
      }
      iVar3 = memcmp(local_40,local_70.second.ptr_,__n);
      bVar4 = true;
      if (-1 < iVar3) {
        bVar4 = iVar3 == 0 && uVar1 < local_70.second.length_;
      }
    }
    else {
      __s1 = lhs->ptr_;
      uVar1 = lhs->length_;
      SymbolEntry::AsString_abi_cxx11_(&local_90,rhs,this->index);
      __s2._M_p = local_90._M_dataplus._M_p;
      sVar2 = local_90._M_string_length;
      if ((long)local_90._M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_90._M_string_length,"string length exceeds max size");
      }
      __n_00 = sVar2;
      if (uVar1 < sVar2) {
        __n_00 = uVar1;
      }
      iVar3 = memcmp(__s1,__s2._M_p,__n_00);
      bVar4 = iVar3 < 0 || iVar3 == 0 && uVar1 < sVar2;
      if ((StringPiece *)local_90._M_dataplus._M_p != (StringPiece *)&local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
  }
  else {
    bVar4 = SUB41((uint)iVar3 >> 0x1f,0);
  }
  return bVar4;
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }